

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bilateral_filter.hpp
# Opt level: O0

void MeanField::Filtering::applyBilateralKernelY
               (float *input,float *output,uchar *rgb,float *spatialKernel,float *intensityKernel,
               float spatialSD,float intensitySD,int dim,int x,int y,int W,int H)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  double dVar9;
  int local_78;
  int local_74;
  int local_70;
  int i_2;
  int i_1;
  float intensityFactor;
  float spatialFactor;
  int neighPixelIdx;
  int pixelIdx;
  int idx;
  int r;
  float normaliser;
  int rad;
  int i;
  float *channelSums;
  int dim_local;
  float intensitySD_local;
  float spatialSD_local;
  float *intensityKernel_local;
  float *spatialKernel_local;
  uchar *rgb_local;
  float *output_local;
  float *input_local;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)dim;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  for (normaliser = 0.0; (int)normaliser < dim; normaliser = (float)((int)normaliser + 1)) {
    *(undefined4 *)((long)pvVar8 + (long)(int)normaliser * 4) = 0;
  }
  if (spatialSD <= intensitySD) {
    local_78 = (int)intensitySD;
  }
  else {
    local_78 = (int)spatialSD;
  }
  idx = 0;
  for (pixelIdx = -local_78; pixelIdx <= local_78; pixelIdx = pixelIdx + 1) {
    iVar4 = y + pixelIdx;
    if ((-1 < iVar4) && (iVar4 < H)) {
      iVar5 = (y * W + x) * 3;
      iVar6 = (iVar4 * W + x) * 3;
      i_1 = 0x3f800000;
      if ((-spatialSD <= (float)pixelIdx) && ((float)pixelIdx <= spatialSD)) {
        dVar9 = std::fabs((double)(ulong)(uint)(float)pixelIdx);
        i_1 = (int)spatialKernel[(int)SUB84(dVar9,0)];
      }
      i_2 = 0x3f800000;
      if ((-intensitySD <= (float)pixelIdx) && ((float)pixelIdx <= intensitySD)) {
        dVar9 = std::fabs((double)(ulong)(uint)((float)rgb[iVar6] - (float)rgb[iVar5]));
        fVar1 = intensityKernel[(int)SUB84(dVar9,0)];
        dVar9 = std::fabs((double)(ulong)(uint)((float)rgb[(long)iVar6 + 1] -
                                               (float)rgb[(long)iVar5 + 1]));
        fVar2 = intensityKernel[(int)SUB84(dVar9,0)];
        dVar9 = std::fabs((double)(ulong)(uint)((float)rgb[(long)iVar6 + 2] -
                                               (float)rgb[(long)iVar5 + 2]));
        i_2 = (int)(fVar1 * fVar2 * intensityKernel[(int)SUB84(dVar9,0)]);
      }
      idx = (int)((float)i_1 * (float)i_2 + (float)idx);
      for (local_70 = 0; local_70 < dim; local_70 = local_70 + 1) {
        *(float *)((long)pvVar8 + (long)local_70 * 4) =
             input[(iVar4 * W + x) * dim + local_70] * (float)i_1 * (float)i_2 +
             *(float *)((long)pvVar8 + (long)local_70 * 4);
      }
    }
  }
  if (0.0 < (float)idx) {
    for (local_74 = 0; local_74 < dim; local_74 = local_74 + 1) {
      output[(y * W + x) * dim + local_74] =
           *(float *)((long)pvVar8 + (long)local_74 * 4) / (float)idx;
    }
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyBilateralKernelY(const float *input, float *output, const unsigned char *rgb, const float *spatialKernel,
                const float *intensityKernel, float spatialSD, float intensitySD, int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = (spatialSD > intensitySD) ? static_cast<int>(spatialSD) : static_cast<int>(intensitySD);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                int pixelIdx = 3 * (y*W + x);
                int neighPixelIdx = 3 * (idx*W + x);

                float spatialFactor = 1.0;
                if (r >= -spatialSD && r <= spatialSD) {
                    spatialFactor = spatialKernel[static_cast<int>(fabs(static_cast<float>(r)))];
                }

                float intensityFactor = 1.0;
                if (r >= -intensitySD && r <= intensitySD) {
                    intensityFactor = intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx]) - static_cast<float>(rgb[pixelIdx])))] *//R
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 1]) - static_cast<float>(rgb[pixelIdx + 1])))] *//G
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 2]) - static_cast<float>(rgb[pixelIdx + 2])))];//B
                }

                normaliser += spatialFactor * intensityFactor;
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * spatialFactor*intensityFactor;
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }

            delete[] channelSums;
        }